

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void solver2_canceluntil(sat_solver2 *s,int level)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  uVar1 = (s->trail_lim).size;
  if ((int)uVar1 <= level) {
    return;
  }
  if (0 < (int)uVar1) {
    piVar4 = (s->trail_lim).ptr;
    iVar2 = piVar4[level];
    iVar3 = piVar4[(ulong)uVar1 - 1];
    for (lVar5 = (long)s->qtail; iVar2 < lVar5; lVar5 = lVar5 + -1) {
      iVar6 = s->trail[lVar5 + -1] >> 1;
      s->assigns[iVar6] = '\x03';
      s->reasons[iVar6] = 0;
      s->units[iVar6] = 0;
      if (lVar5 <= iVar3) {
        *(byte *)(s->vi + iVar6) =
             (*(byte *)(s->vi + iVar6) & 0xfe | *(byte *)(s->trail + lVar5 + -1) & 1) ^ 1;
      }
    }
    for (lVar5 = (long)s->qhead; iVar2 < lVar5; lVar5 = lVar5 + -1) {
      order_unassigned(s,s->trail[lVar5 + -1] >> 1);
    }
    s->qtail = iVar2;
    s->qhead = iVar2;
    veci_resize(&s->trail_lim,level);
    return;
  }
  __assert_fail("solver2_dlevel(s) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                ,0x1f0,"void solver2_canceluntil(sat_solver2 *, int)");
}

Assistant:

static void solver2_canceluntil(sat_solver2* s, int level) {
    int      bound;
    int      lastLev;
    int      c, x;

    if (solver2_dlevel(s) <= level)
        return;
    assert( solver2_dlevel(s) > 0 );

    bound   = (veci_begin(&s->trail_lim))[level];
    lastLev = (veci_begin(&s->trail_lim))[veci_size(&s->trail_lim)-1];

    for (c = s->qtail-1; c >= bound; c--)
    {
        x = lit_var(s->trail[c]);
        var_set_value(s, x, varX);
        s->reasons[x] = 0;
        s->units[x] = 0; // temporary?
        if ( c < lastLev )
            var_set_polar(s, x, !lit_sign(s->trail[c]));
    }

    for (c = s->qhead-1; c >= bound; c--)
        order_unassigned(s,lit_var(s->trail[c]));

    s->qhead = s->qtail = bound;
    veci_resize(&s->trail_lim,level);
}